

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_int>::sortMinUp
          (btAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,btDispatcher *dispatcher,
          bool updateOverlaps)

{
  int *piVar1;
  undefined1 auVar2 [16];
  btOverlappingPairCallback *pbVar3;
  bool bVar4;
  uint axis0;
  long lVar5;
  Handle *pHandleA;
  Edge *pEVar6;
  long lVar7;
  int *piVar8;
  Handle *handle1;
  Handle *pHandleB;
  undefined1 auVar9 [16];
  
  lVar7 = (long)axis;
  pEVar6 = this->m_pEdges[lVar7] + edge;
  axis0 = 1 << ((byte)axis & 0x1f) & 3;
  piVar8 = (int *)((long)(&this->m_pHandles[pEVar6->m_handle].super_btBroadphaseProxy.m_aabbMax + 1)
                  + lVar7 * 4);
  for (; ((ulong)pEVar6[1].m_handle != 0 && (pEVar6[1].m_pos <= pEVar6->m_pos)); pEVar6 = pEVar6 + 1
      ) {
    pHandleB = this->m_pHandles + pEVar6[1].m_handle;
    lVar5 = 0x3c;
    if (((pEVar6[1].m_pos & 1) != 0) && (lVar5 = 0x48, updateOverlaps)) {
      pHandleA = this->m_pHandles + pEVar6->m_handle;
      bVar4 = testOverlap2D(this,pHandleA,pHandleB,axis0,1 << (sbyte)axis0 & 3);
      lVar5 = 0x48;
      if (bVar4) {
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[3])
                  (this->m_pairCache,pHandleA,pHandleB,dispatcher);
        lVar5 = 0x48;
        pbVar3 = this->m_userPairCallback;
        if (pbVar3 != (btOverlappingPairCallback *)0x0) {
          (*pbVar3->_vptr_btOverlappingPairCallback[3])(pbVar3,pHandleA,pHandleB,dispatcher);
          lVar5 = 0x48;
        }
      }
    }
    piVar1 = (int *)((long)(pHandleB->super_btBroadphaseProxy).m_aabbMin.m_floats +
                    lVar7 * 4 + lVar5 + -0x1c);
    *piVar1 = *piVar1 + -1;
    *piVar8 = *piVar8 + 1;
    auVar2 = *(undefined1 (*) [16])pEVar6;
    auVar9._0_8_ = auVar2._8_8_;
    auVar9._8_4_ = auVar2._0_4_;
    auVar9._12_4_ = auVar2._4_4_;
    *(undefined1 (*) [16])pEVar6 = auVar9;
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* dispatcher, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		if (pNext->IsMax())
		{
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pNext->m_handle);
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;
			
			// if next edge is maximum remove any overlap between the two handles
			if (updateOverlaps 
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0,handle1,axis1,axis2)
#endif //USE_OVERLAP_TEST_ON_REMOVES
				)
			{
				

				m_pairCache->removeOverlappingPair(handle0,handle1,dispatcher);	
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0,handle1,dispatcher);
				
			}


			// update edge reference in other handle
			pHandleNext->m_maxEdges[axis]--;
		}
		else
			pHandleNext->m_minEdges[axis]--;

		pHandleEdge->m_minEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}